

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

ZNames * __thiscall
icu_63::TimeZoneNamesImpl::loadTimeZoneNames
          (TimeZoneNamesImpl *this,UnicodeString *tzID,UErrorCode *status)

{
  UHashtable *cache;
  UBool UVar1;
  int32_t iVar2;
  UChar **names;
  undefined1 local_1a0 [8];
  ZNamesLoader loader;
  void *tznames;
  Char16Ptr local_148;
  int32_t local_13c;
  char16_t local_138 [2];
  int32_t tzIDKeyLen;
  UChar tzIDKey [129];
  UErrorCode *status_local;
  UnicodeString *tzID_local;
  TimeZoneNamesImpl *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    Char16Ptr::Char16Ptr(&local_148,local_138);
    iVar2 = icu_63::UnicodeString::extract(tzID,&local_148,0x81,status);
    Char16Ptr::~Char16Ptr(&local_148);
    local_138[iVar2] = L'\0';
    local_13c = iVar2;
    loader.names[6] = (UChar *)uhash_get_63(this->fTZNamesMap,local_138);
    if (loader.names[6] == (UChar *)0x0) {
      ZNames::ZNamesLoader::ZNamesLoader((ZNamesLoader *)local_1a0);
      ZNames::ZNamesLoader::loadTimeZone((ZNamesLoader *)local_1a0,this->fZoneStrings,tzID,status);
      cache = this->fTZNamesMap;
      names = ZNames::ZNamesLoader::getNames((ZNamesLoader *)local_1a0);
      loader.names[6] = (UChar *)ZNames::createTimeZoneAndPutInCache(cache,names,tzID,status);
      UVar1 = ::U_FAILURE(*status);
      if (UVar1 != '\0') {
        this_local = (TimeZoneNamesImpl *)0x0;
      }
      ZNames::ZNamesLoader::~ZNamesLoader((ZNamesLoader *)local_1a0);
      if (UVar1 != '\0') {
        return (ZNames *)this_local;
      }
    }
    this_local = (TimeZoneNamesImpl *)loader.names[6];
  }
  else {
    this_local = (TimeZoneNamesImpl *)0x0;
  }
  return (ZNames *)this_local;
}

Assistant:

ZNames*
TimeZoneNamesImpl::loadTimeZoneNames(const UnicodeString& tzID, UErrorCode& status) {
    if (U_FAILURE(status)) { return NULL; }
    U_ASSERT(tzID.length() <= ZID_KEY_MAX);

    UChar tzIDKey[ZID_KEY_MAX + 1];
    int32_t tzIDKeyLen = tzID.extract(tzIDKey, ZID_KEY_MAX + 1, status);
    U_ASSERT(U_SUCCESS(status));   // already checked length above
    tzIDKey[tzIDKeyLen] = 0;

    void *tznames = uhash_get(fTZNamesMap, tzIDKey);
    if (tznames == NULL) {
        ZNames::ZNamesLoader loader;
        loader.loadTimeZone(fZoneStrings, tzID, status);
        tznames = ZNames::createTimeZoneAndPutInCache(fTZNamesMap, loader.getNames(), tzID, status);
        if (U_FAILURE(status)) { return NULL; }
    }

    // tznames is never EMPTY
    return (ZNames*)tznames;
}